

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::MultisampleTextureUsageCase::sampleTexture
          (MultisampleTextureUsageCase *this,Surface *dst,float value)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  RenderContext *pRVar8;
  long lVar9;
  TestLog *this_00;
  MessageBuilder *this_01;
  float *pfVar10;
  PixelBufferAccess local_210;
  MessageBuilder local_1e8;
  undefined1 local_68 [8];
  Buffer vertexAttibBuffer;
  GLenum textureTarget;
  int valueLocation;
  int layerLocation;
  int maxSamplesLocation;
  int samplerLocation;
  int posLocation;
  Functions *gl;
  float value_local;
  Surface *dst_local;
  MultisampleTextureUsageCase *this_local;
  undefined4 extraout_var;
  
  if (Functional::(anonymous_namespace)::MultisampleTextureUsageCase::
      sampleTexture(tcu::Surface&,float)::fullscreenQuad == '\0') {
    iVar2 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::MultisampleTextureUsageCase::
                                 sampleTexture(tcu::Surface&,float)::fullscreenQuad);
    if (iVar2 != 0) {
      tcu::Vector<float,_4>::Vector(sampleTexture::fullscreenQuad,-1.0,-1.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector(sampleTexture::fullscreenQuad + 1,-1.0,1.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector(sampleTexture::fullscreenQuad + 2,1.0,-1.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector(sampleTexture::fullscreenQuad + 3,1.0,1.0,0.0,1.0);
      __cxa_guard_release(&Functional::(anonymous_namespace)::MultisampleTextureUsageCase::
                           sampleTexture(tcu::Surface&,float)::fullscreenQuad);
    }
  }
  pRVar8 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar2);
  pcVar1 = *(code **)(lVar9 + 0x780);
  dVar3 = glu::ShaderProgram::getProgram(this->m_samplerShader);
  uVar4 = (*pcVar1)(dVar3,"a_position");
  pcVar1 = *(code **)(lVar9 + 0xb48);
  dVar3 = glu::ShaderProgram::getProgram(this->m_samplerShader);
  uVar5 = (*pcVar1)(dVar3,"u_sampler");
  pcVar1 = *(code **)(lVar9 + 0xb48);
  dVar3 = glu::ShaderProgram::getProgram(this->m_samplerShader);
  uVar6 = (*pcVar1)(dVar3,"u_maxSamples");
  pcVar1 = *(code **)(lVar9 + 0xb48);
  dVar3 = glu::ShaderProgram::getProgram(this->m_samplerShader);
  uVar7 = (*pcVar1)(dVar3,"u_layer");
  pcVar1 = *(code **)(lVar9 + 0xb48);
  dVar3 = glu::ShaderProgram::getProgram(this->m_samplerShader);
  vertexAttibBuffer.super_ObjectWrapper._20_4_ = (*pcVar1)(dVar3,"u_cmpValue");
  vertexAttibBuffer.super_ObjectWrapper.m_object = (this->m_isArrayType & 1) * 2 + 0x9100;
  pRVar8 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_68,pRVar8);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [23])"Sampling from texture.");
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e8);
  pcVar1 = *(code **)(lVar9 + 0x40);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_68);
  (*pcVar1)(0x8892,dVar3);
  pcVar1 = *(code **)(lVar9 + 0x150);
  pfVar10 = tcu::Vector<float,_4>::getPtr(sampleTexture::fullscreenQuad);
  (*pcVar1)(0x8892,0x40,pfVar10,0x88e4);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"bufferdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5cc);
  (**(code **)(lVar9 + 0x1a00))(0,0,0x100);
  (**(code **)(lVar9 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar9 + 0x188))(0x4000);
  (**(code **)(lVar9 + 0x19f0))(uVar4,4,0x1406,0,0,0);
  (**(code **)(lVar9 + 0x610))(uVar4);
  pcVar1 = *(code **)(lVar9 + 0x1680);
  dVar3 = glu::ShaderProgram::getProgram(this->m_samplerShader);
  (*pcVar1)(dVar3);
  (**(code **)(lVar9 + 0x14f0))(uVar5,0);
  (**(code **)(lVar9 + 0x14f0))(uVar6,this->m_numSamples);
  if ((this->m_isArrayType & 1U) != 0) {
    (**(code **)(lVar9 + 0x14f0))(uVar7,3);
  }
  (**(code **)(lVar9 + 0x14e0))(value,vertexAttibBuffer.super_ObjectWrapper._20_4_);
  (**(code **)(lVar9 + 0xb8))(vertexAttibBuffer.super_ObjectWrapper.m_object,this->m_textureID);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"setup draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5e0);
  (**(code **)(lVar9 + 0x538))(5,0,4);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5e3);
  (**(code **)(lVar9 + 0x518))(uVar4);
  (**(code **)(lVar9 + 0x1680))(0);
  dVar3 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar3,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x5e9);
  (**(code **)(lVar9 + 0x648))();
  pRVar8 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_210,dst);
  glu::readPixels(pRVar8,0,0,&local_210);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_68);
  return;
}

Assistant:

void MultisampleTextureUsageCase::sampleTexture (tcu::Surface& dst, float value)
{
	static const tcu::Vec4 fullscreenQuad[] =
	{
		tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
	};

	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const int				posLocation			= gl.getAttribLocation(m_samplerShader->getProgram(), "a_position");
	const int				samplerLocation		= gl.getUniformLocation(m_samplerShader->getProgram(), "u_sampler");
	const int				maxSamplesLocation	= gl.getUniformLocation(m_samplerShader->getProgram(), "u_maxSamples");
	const int				layerLocation		= gl.getUniformLocation(m_samplerShader->getProgram(), "u_layer");
	const int				valueLocation		= gl.getUniformLocation(m_samplerShader->getProgram(), "u_cmpValue");
	const glw::GLenum		textureTarget		= (m_isArrayType) ? (GL_TEXTURE_2D_MULTISAMPLE_ARRAY) : (GL_TEXTURE_2D_MULTISAMPLE);
	glu::Buffer				vertexAttibBuffer	(m_context.getRenderContext());

	m_testCtx.getLog() << tcu::TestLog::Message << "Sampling from texture." << tcu::TestLog::EndMessage;

	// upload data

	gl.bindBuffer(GL_ARRAY_BUFFER, *vertexAttibBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(fullscreenQuad), fullscreenQuad[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bufferdata");

	// clear

	gl.viewport(0, 0, s_textureSize, s_textureSize);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// setup shader and draw

	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.enableVertexAttribArray(posLocation);

	gl.useProgram(m_samplerShader->getProgram());
	gl.uniform1i(samplerLocation, 0);
	gl.uniform1i(maxSamplesLocation, m_numSamples);
	if (m_isArrayType)
		gl.uniform1i(layerLocation, s_textureLayer);
	gl.uniform1f(valueLocation, value);
	gl.bindTexture(textureTarget, m_textureID);
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup draw");

	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

	// clean state

	gl.disableVertexAttribArray(posLocation);
	gl.useProgram(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clean");

	// read results
	gl.finish();
	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());
}